

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O2

void rw::AnimInterpolatorInfo::registerInterp(AnimInterpolatorInfo *interpInfo)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 10) {
      return;
    }
    lVar1 = lVar3 + 1;
    plVar2 = &interpInfoList + lVar3;
    lVar3 = lVar1;
  } while (*plVar2 != 0);
  *(AnimInterpolatorInfo **)(&gl3::needToReadBackTextures + lVar1 * 2) = interpInfo;
  return;
}

Assistant:

void
AnimInterpolatorInfo::registerInterp(AnimInterpolatorInfo *interpInfo)
{
	for(int32 i = 0; i < MAXINTERPINFO; i++)
		if(interpInfoList[i] == nil){
			interpInfoList[i] = interpInfo;
			return;
		}
	assert(0 && "no room for interpolatorInfo");
}